

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O2

bool __thiscall draco::ObjEncoder::EncodeFaceCorner(ObjEncoder *this,PointIndex vert_index)

{
  PointAttribute *pPVar1;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> IVar2;
  PointIndex PVar3;
  char local_1b [3];
  
  local_1b[2] = 0x20;
  EncoderBuffer::Encode<char>(this->out_buffer_,local_1b + 2);
  IVar2.value_ = vert_index.value_;
  if (this->pos_att_->identity_mapping_ == false) {
    IVar2.value_ = (this->pos_att_->indices_map_).vector_.
                   super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[vert_index.value_].value_;
  }
  EncodeInt(this,IVar2.value_ + 1);
  if (this->normal_att_ != (PointAttribute *)0x0 || this->tex_coord_att_ != (PointAttribute *)0x0) {
    local_1b[1] = 0x2f;
    EncoderBuffer::Encode<char>(this->out_buffer_,local_1b + 1);
    pPVar1 = this->tex_coord_att_;
    if (pPVar1 != (PointAttribute *)0x0) {
      PVar3.value_ = vert_index.value_;
      if (pPVar1->identity_mapping_ == false) {
        PVar3.value_ = (pPVar1->indices_map_).vector_.
                       super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[vert_index.value_].value_;
      }
      EncodeInt(this,PVar3.value_ + 1);
    }
    if (this->normal_att_ != (PointAttribute *)0x0) {
      local_1b[0] = '/';
      EncoderBuffer::Encode<char>(this->out_buffer_,local_1b);
      if (this->normal_att_->identity_mapping_ == false) {
        vert_index.value_ =
             (this->normal_att_->indices_map_).vector_.
             super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[vert_index.value_].value_;
      }
      EncodeInt(this,vert_index.value_ + 1);
    }
  }
  return true;
}

Assistant:

bool ObjEncoder::EncodeFaceCorner(PointIndex vert_index) {
  buffer()->Encode(' ');
  // Note that in the OBJ format, all indices are encoded starting from index 1.
  // Encode position index.
  EncodeInt(pos_att_->mapped_index(vert_index).value() + 1);
  if (tex_coord_att_ || normal_att_) {
    // Encoding format is pos_index/tex_coord_index/normal_index.
    // If tex_coords are not present, we must encode pos_index//normal_index.
    buffer()->Encode('/');
    if (tex_coord_att_) {
      EncodeInt(tex_coord_att_->mapped_index(vert_index).value() + 1);
    }
    if (normal_att_) {
      buffer()->Encode('/');
      EncodeInt(normal_att_->mapped_index(vert_index).value() + 1);
    }
  }
  return true;
}